

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O2

uint64_t __thiscall spvtools::opt::analysis::ScalarConstant::GetU64BitValue(ScalarConstant *this)

{
  undefined4 uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  iVar2 = (*(this->super_Constant)._vptr_Constant[0x18])();
  if (((long *)CONCAT44(extraout_var,iVar2))[1] - *(long *)CONCAT44(extraout_var,iVar2) == 8) {
    iVar2 = (*(this->super_Constant)._vptr_Constant[0x18])(this);
    uVar1 = *(undefined4 *)(*(long *)CONCAT44(extraout_var_00,iVar2) + 4);
    iVar2 = (*(this->super_Constant)._vptr_Constant[0x18])(this);
    return CONCAT44(uVar1,**(undefined4 **)CONCAT44(extraout_var_01,iVar2));
  }
  __assert_fail("words().size() == 2",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/constants.h"
                ,0xb0,"uint64_t spvtools::opt::analysis::ScalarConstant::GetU64BitValue() const");
}

Assistant:

uint64_t GetU64BitValue() const {
    // Relies on unsigned values smaller than 64-bit being zero extended.  See
    // section 2.2.1 of the SPIR-V spec.
    assert(words().size() == 2);
    return static_cast<uint64_t>(words()[1]) << 32 |
           static_cast<uint64_t>(words()[0]);
  }